

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O3

void CVodeSensFree(void *cvode_mem)

{
  if (cvode_mem != (void *)0x0) {
    if (*(int *)((long)cvode_mem + 0x860) != 0) {
      if (*(int *)((long)cvode_mem + 0x318) != 0) {
        free(*(void **)((long)cvode_mem + 0x590));
        *(undefined8 *)((long)cvode_mem + 0x590) = 0;
        free(*(void **)((long)cvode_mem + 0x670));
        *(undefined8 *)((long)cvode_mem + 0x670) = 0;
        free(*(void **)((long)cvode_mem + 0x688));
        *(undefined8 *)((long)cvode_mem + 0x688) = 0;
        free(*(void **)((long)cvode_mem + 0x6a0));
        *(undefined8 *)((long)cvode_mem + 0x6a0) = 0;
        *(undefined4 *)((long)cvode_mem + 0x318) = 0;
      }
      cvSensFreeVectors((CVodeMem)cvode_mem);
      *(undefined4 *)((long)cvode_mem + 0x860) = 0;
      *(undefined4 *)((long)cvode_mem + 0x8c) = 0;
    }
    if (*(int *)((long)cvode_mem + 0x7b8) != 0) {
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x788));
      *(undefined8 *)((long)cvode_mem + 0x788) = 0;
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x790));
      *(undefined8 *)((long)cvode_mem + 0x790) = 0;
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x798));
      *(undefined8 *)((long)cvode_mem + 0x798) = 0;
      *(undefined4 *)((long)cvode_mem + 0x7b8) = 0;
    }
    if (*(int *)((long)cvode_mem + 0x7bc) != 0) {
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7a0));
      *(undefined8 *)((long)cvode_mem + 0x7a0) = 0;
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7a8));
      *(undefined8 *)((long)cvode_mem + 0x7a8) = 0;
      N_VDestroy(*(undefined8 *)((long)cvode_mem + 0x7b0));
      *(undefined8 *)((long)cvode_mem + 0x7b0) = 0;
      *(undefined4 *)((long)cvode_mem + 0x7bc) = 0;
    }
    if (*(int *)((long)cvode_mem + 0x740) != 0) {
      SUNNonlinSolFree(*(undefined8 *)((long)cvode_mem + 0x738));
      *(undefined4 *)((long)cvode_mem + 0x740) = 0;
      *(undefined8 *)((long)cvode_mem + 0x738) = 0;
    }
    if (*(int *)((long)cvode_mem + 0x750) != 0) {
      SUNNonlinSolFree(*(undefined8 *)((long)cvode_mem + 0x748));
      *(undefined4 *)((long)cvode_mem + 0x750) = 0;
      *(undefined8 *)((long)cvode_mem + 0x748) = 0;
    }
    if (*(int *)((long)cvode_mem + 0x760) != 0) {
      SUNNonlinSolFree(*(undefined8 *)((long)cvode_mem + 0x758));
      *(undefined4 *)((long)cvode_mem + 0x760) = 0;
      *(undefined8 *)((long)cvode_mem + 0x758) = 0;
    }
    if (*(void **)((long)cvode_mem + 0x100) != (void *)0x0) {
      free(*(void **)((long)cvode_mem + 0x100));
      *(undefined8 *)((long)cvode_mem + 0x100) = 0;
    }
  }
  return;
}

Assistant:

void CVodeSensFree(void* cvode_mem)
{
  CVodeMem cv_mem;

  if (cvode_mem == NULL) { return; }
  cv_mem = (CVodeMem)cvode_mem;

  if (cv_mem->cv_SensMallocDone)
  {
    if (cv_mem->cv_stgr1alloc)
    {
      free(cv_mem->cv_ncfS1);
      cv_mem->cv_ncfS1 = NULL;
      free(cv_mem->cv_ncfnS1);
      cv_mem->cv_ncfnS1 = NULL;
      free(cv_mem->cv_nniS1);
      cv_mem->cv_nniS1 = NULL;
      free(cv_mem->cv_nnfS1);
      cv_mem->cv_nnfS1      = NULL;
      cv_mem->cv_stgr1alloc = SUNFALSE;
    }
    cvSensFreeVectors(cv_mem);
    cv_mem->cv_SensMallocDone = SUNFALSE;
    cv_mem->cv_sensi          = SUNFALSE;
  }

  /* free any vector wrappers */
  if (cv_mem->simMallocDone)
  {
    N_VDestroy(cv_mem->zn0Sim);
    cv_mem->zn0Sim = NULL;
    N_VDestroy(cv_mem->ycorSim);
    cv_mem->ycorSim = NULL;
    N_VDestroy(cv_mem->ewtSim);
    cv_mem->ewtSim        = NULL;
    cv_mem->simMallocDone = SUNFALSE;
  }
  if (cv_mem->stgMallocDone)
  {
    N_VDestroy(cv_mem->zn0Stg);
    cv_mem->zn0Stg = NULL;
    N_VDestroy(cv_mem->ycorStg);
    cv_mem->ycorStg = NULL;
    N_VDestroy(cv_mem->ewtStg);
    cv_mem->ewtStg        = NULL;
    cv_mem->stgMallocDone = SUNFALSE;
  }

  /* if CVODES created a NLS object then free it */
  if (cv_mem->ownNLSsim)
  {
    SUNNonlinSolFree(cv_mem->NLSsim);
    cv_mem->ownNLSsim = SUNFALSE;
    cv_mem->NLSsim    = NULL;
  }
  if (cv_mem->ownNLSstg)
  {
    SUNNonlinSolFree(cv_mem->NLSstg);
    cv_mem->ownNLSstg = SUNFALSE;
    cv_mem->NLSstg    = NULL;
  }
  if (cv_mem->ownNLSstg1)
  {
    SUNNonlinSolFree(cv_mem->NLSstg1);
    cv_mem->ownNLSstg1 = SUNFALSE;
    cv_mem->NLSstg1    = NULL;
  }

  /* free min atol array if necessary */
  if (cv_mem->cv_atolSmin0)
  {
    free(cv_mem->cv_atolSmin0);
    cv_mem->cv_atolSmin0 = NULL;
  }
}